

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O3

zt_mem_heap * zt_mem_heap_init(char *name,size_t size)

{
  zt_mem_heap *pzVar1;
  char *pcVar2;
  
  pzVar1 = (zt_mem_heap *)malloc(size + 0x10);
  if (pzVar1 != (zt_mem_heap *)0x0) {
    pcVar2 = "*unknown*";
    if (name != (char *)0x0) {
      pcVar2 = name;
    }
    pcVar2 = zt_mem_strdup(pcVar2);
    pzVar1->name = pcVar2;
    pzVar1->size = size;
  }
  return pzVar1;
}

Assistant:

zt_mem_heap*
zt_mem_heap_init(char *name, size_t size)
{
    zt_mem_heap * heap;

    if ((heap = GLOBAL_zmt.alloc(sizeof(zt_mem_heap) + size)) == NULL) {
        return NULL;
    }

    heap->name = zt_mem_strdup(name ? name : "*unknown*");
    heap->size = size;
    return heap;
}